

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var * __thiscall
cs::domain_manager::get_var_global<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  var *pvVar1;
  domain_type *in_RSI;
  stack_type<cs::domain_type,_std::allocator> *in_stack_00000030;
  var_id *in_stack_ffffffffffffffe8;
  
  stack_type<cs::domain_type,_std::allocator>::bottom(in_stack_00000030);
  pvVar1 = domain_type::get_var(in_RSI,in_stack_ffffffffffffffe8);
  return pvVar1;
}

Assistant:

var &get_var_global(T &&name)
		{
			return m_data.bottom().get_var(name);
		}